

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O2

void Image_Function::GetGaussianKernel
               (vector<float,_std::allocator<float>_> *filter,uint32_t width,uint32_t height,
               uint32_t kernelSize,float sigma)

{
  pointer pfVar1;
  uint uVar2;
  imageException *this;
  pointer pfVar3;
  int iVar4;
  long lVar5;
  pointer pfVar6;
  int32_t posX;
  int iVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 in_register_00001284 [12];
  float local_60;
  
  if (((2 < width) && (2 < height)) && (kernelSize != 0)) {
    uVar2 = kernelSize * 2;
    if (((uVar2 < width) && (uVar2 < height)) && (0.0 <= sigma)) {
      std::vector<float,_std::allocator<float>_>::resize(filter,(ulong)(height * width));
      pfVar1 = (filter->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar6 = (filter->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pfVar3 = pfVar6; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
        *pfVar3 = 0.0;
      }
      pfVar6 = pfVar6 + (ulong)(((height >> 1) - kernelSize) * width) +
                        ((ulong)(width >> 1) - (ulong)kernelSize);
      pfVar1 = pfVar6 + (kernelSize * 2 + 1) * width;
      local_60 = 0.0;
      iVar4 = -kernelSize;
      for (pfVar3 = pfVar6; pfVar3 != pfVar1; pfVar3 = pfVar3 + width) {
        iVar7 = -kernelSize;
        for (lVar5 = 0; (ulong)uVar2 * 4 + 4 != lVar5; lVar5 = lVar5 + 4) {
          auVar10._0_4_ = (float)(iVar7 * iVar7 + iVar4 * iVar4);
          auVar10._4_12_ = in_register_00001284;
          auVar8._8_4_ = 0x80000000;
          auVar8._0_8_ = 0x8000000080000000;
          auVar8._12_4_ = 0x80000000;
          auVar8 = vxorps_avx512vl(auVar10,auVar8);
          fVar9 = expf(auVar8._0_4_ / (sigma + sigma));
          fVar9 = fVar9 * (1.0 / ((sigma + sigma) * 3.1415927));
          iVar7 = iVar7 + 1;
          local_60 = local_60 + fVar9;
          *(float *)((long)pfVar3 + lVar5) = fVar9;
        }
        iVar4 = iVar4 + 1;
      }
      for (; pfVar6 != pfVar1; pfVar6 = pfVar6 + width) {
        for (lVar5 = 0; (ulong)uVar2 * 4 + 4 != lVar5; lVar5 = lVar5 + 4) {
          *(float *)((long)pfVar6 + lVar5) = (1.0 / local_60) * *(float *)((long)pfVar6 + lVar5);
        }
      }
      return;
    }
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Incorrect input parameters for Gaussian filter kernel");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GetGaussianKernel( std::vector<float> & filter, uint32_t width, uint32_t height, uint32_t kernelSize, float sigma )
    {
        if( width < 3 || height < 3 || kernelSize == 0 || width < (kernelSize * 2 + 1) || height < (kernelSize * 2 + 1) || sigma < 0 )
            throw imageException( "Incorrect input parameters for Gaussian filter kernel" );

        filter.resize( width * height );

        std::fill( filter.begin(), filter.end(), 0.0f );

        static const float pi = 3.1415926536f;
        const float doubleSigma = sigma * 2;
        const float doubleSigmaPiInv = 1.0f / (doubleSigma * pi);
        const uint32_t twiceKernelSizePlusOne = 2 * kernelSize + 1;

        float * y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;
        const float * endY = y + twiceKernelSizePlusOne * width;

        float sum = 0;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;
            const int32_t posY2 = posY * posY;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x = doubleSigmaPiInv * expf( -static_cast<float>(posX * posX + posY2) / doubleSigma );
                sum += *x;
            }
        }

        const float normalization = 1.0f / sum;

        y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x *= normalization;
            }
        }
    }